

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dchCnf.c
# Opt level: O2

void Dch_AddClausesSuper(Dch_Man_t *p,Aig_Obj_t *pNode,Vec_Ptr_t *vSuper)

{
  uint uVar1;
  int *piVar2;
  int iVar3;
  uint *begin;
  void *pvVar4;
  long lVar5;
  int iVar6;
  long lVar7;
  
  if (((ulong)pNode & 1) != 0) {
    __assert_fail("!Aig_IsComplement(pNode)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/dch/dchCnf.c"
                  ,0xa8,"void Dch_AddClausesSuper(Dch_Man_t *, Aig_Obj_t *, Vec_Ptr_t *)");
  }
  if (0xfffffffd < (*(uint *)&pNode->field_0x18 & 7) - 7) {
    lVar5 = (long)vSuper->nSize;
    begin = (uint *)malloc(lVar5 * 4 + 4);
    iVar6 = 0;
    do {
      iVar3 = vSuper->nSize;
      if (iVar3 <= iVar6) {
        for (lVar7 = 0; lVar7 < iVar3; lVar7 = lVar7 + 1) {
          pvVar4 = Vec_PtrEntry(vSuper,(int)lVar7);
          uVar1 = ((uint)pvVar4 & 1) +
                  p->pSatVars[*(int *)(((ulong)pvVar4 & 0xfffffffffffffffe) + 0x24)] * 2;
          begin[lVar7] = uVar1 ^ 1;
          if ((p->pPars->fPolarFlip != 0) &&
             ((*(byte *)(((ulong)pvVar4 & 0xfffffffffffffffe) + 0x18) & 8) != 0)) {
            begin[lVar7] = uVar1;
          }
          iVar3 = vSuper->nSize;
        }
        uVar1 = p->pSatVars[pNode->Id] * 2;
        begin[lVar5] = uVar1;
        if ((p->pPars->fPolarFlip != 0) && ((pNode->field_0x18 & 8) != 0)) {
          begin[lVar5] = uVar1 | 1;
        }
        iVar6 = sat_solver_addclause(p->pSat,(lit *)begin,(lit *)(begin + lVar5 + 1));
        if (iVar6 != 0) {
          free(begin);
          return;
        }
        __assert_fail("RetValue",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/dch/dchCnf.c"
                      ,0xca,"void Dch_AddClausesSuper(Dch_Man_t *, Aig_Obj_t *, Vec_Ptr_t *)");
      }
      pvVar4 = Vec_PtrEntry(vSuper,iVar6);
      piVar2 = p->pSatVars;
      uVar1 = ((uint)pvVar4 & 1) + piVar2[*(int *)(((ulong)pvVar4 & 0xfffffffffffffffe) + 0x24)] * 2
      ;
      *begin = uVar1;
      iVar3 = piVar2[pNode->Id];
      begin[1] = iVar3 * 2 + 1;
      if (p->pPars->fPolarFlip != 0) {
        if ((*(byte *)(((ulong)pvVar4 & 0xfffffffffffffffe) + 0x18) & 8) != 0) {
          *begin = uVar1 ^ 1;
        }
        if ((pNode->field_0x18 & 8) != 0) {
          begin[1] = iVar3 * 2;
        }
      }
      iVar3 = sat_solver_addclause(p->pSat,(lit *)begin,(lit *)(begin + 2));
      iVar6 = iVar6 + 1;
    } while (iVar3 != 0);
    __assert_fail("RetValue",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/dch/dchCnf.c"
                  ,0xb9,"void Dch_AddClausesSuper(Dch_Man_t *, Aig_Obj_t *, Vec_Ptr_t *)");
  }
  __assert_fail("Aig_ObjIsNode( pNode )",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/dch/dchCnf.c"
                ,0xa9,"void Dch_AddClausesSuper(Dch_Man_t *, Aig_Obj_t *, Vec_Ptr_t *)");
}

Assistant:

void Dch_AddClausesSuper( Dch_Man_t * p, Aig_Obj_t * pNode, Vec_Ptr_t * vSuper )
{
    Aig_Obj_t * pFanin;
    int * pLits, nLits, RetValue, i;
    assert( !Aig_IsComplement(pNode) );
    assert( Aig_ObjIsNode( pNode ) );
    // create storage for literals
    nLits = Vec_PtrSize(vSuper) + 1;
    pLits = ABC_ALLOC( int, nLits );
    // suppose AND-gate is A & B = C
    // add !A => !C   or   A + !C
    Vec_PtrForEachEntry( Aig_Obj_t *, vSuper, pFanin, i )
    {
        pLits[0] = toLitCond(Dch_ObjSatNum(p,Aig_Regular(pFanin)), Aig_IsComplement(pFanin));
        pLits[1] = toLitCond(Dch_ObjSatNum(p,pNode), 1);
        if ( p->pPars->fPolarFlip )
        {
            if ( Aig_Regular(pFanin)->fPhase )  pLits[0] = lit_neg( pLits[0] );
            if ( pNode->fPhase )                pLits[1] = lit_neg( pLits[1] );
        }
        RetValue = sat_solver_addclause( p->pSat, pLits, pLits + 2 );
        assert( RetValue );
    }
    // add A & B => C   or   !A + !B + C
    Vec_PtrForEachEntry( Aig_Obj_t *, vSuper, pFanin, i )
    {
        pLits[i] = toLitCond(Dch_ObjSatNum(p,Aig_Regular(pFanin)), !Aig_IsComplement(pFanin));
        if ( p->pPars->fPolarFlip )
        {
            if ( Aig_Regular(pFanin)->fPhase )  pLits[i] = lit_neg( pLits[i] );
        }
    }
    pLits[nLits-1] = toLitCond(Dch_ObjSatNum(p,pNode), 0);
    if ( p->pPars->fPolarFlip )
    {
        if ( pNode->fPhase )  pLits[nLits-1] = lit_neg( pLits[nLits-1] );
    }
    RetValue = sat_solver_addclause( p->pSat, pLits, pLits + nLits );
    assert( RetValue );
    ABC_FREE( pLits );
}